

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_opengl.c
# Opt level: O0

void MOJOSHADER_glGetVertexShaderUniformF(uint idx,float *data,uint vec4n)

{
  uint uVar1;
  uint cpy;
  uint maxregs;
  uint vec4n_local;
  float *data_local;
  uint idx_local;
  
  if (idx < 0x2000) {
    uVar1 = minuint(0x2000 - idx,vec4n);
    memcpy(data,ctx->vs_reg_file_f + (idx << 2),(ulong)(uVar1 << 4));
  }
  return;
}

Assistant:

void MOJOSHADER_glGetVertexShaderUniformF(unsigned int idx, float *data,
                                          unsigned int vec4n)
{
    const uint maxregs = STATICARRAYLEN(ctx->vs_reg_file_f) / 4;
    if (idx < maxregs)
    {
        assert(sizeof (GLfloat) == sizeof (float));
        const uint cpy = (minuint(maxregs - idx, vec4n) * sizeof (*data)) * 4;
        memcpy(data, ctx->vs_reg_file_f + (idx * 4), cpy);
    } // if
}